

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.h
# Opt level: O3

void __thiscall
UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
          (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *this,
          AnnotatedMixin<std::recursive_mutex> *pmutexIn,char *pszName,char *pszFile,int nLine,
          bool fTry)

{
  long in_FS_OFFSET;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_unique_lock)._M_device = (mutex_type *)0x0;
  (this->super_unique_lock)._M_owns = false;
  if (pmutexIn != (AnnotatedMixin<std::recursive_mutex> *)0x0) {
    local_30._M_owns = false;
    local_30._M_device = &pmutexIn->super_recursive_mutex;
    std::unique_lock<std::recursive_mutex>::operator=(&this->super_unique_lock,&local_30);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
    if (fTry) {
      std::unique_lock<std::recursive_mutex>::try_lock(&this->super_unique_lock);
    }
    else {
      std::unique_lock<std::recursive_mutex>::lock(&this->super_unique_lock);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCK_FUNCTION(pmutexIn)
    {
        if (!pmutexIn) return;

        *static_cast<Base*>(this) = Base(*pmutexIn, std::defer_lock);
        if (fTry)
            TryEnter(pszName, pszFile, nLine);
        else
            Enter(pszName, pszFile, nLine);
    }